

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RVOSimulator.cc
# Opt level: O0

size_t __thiscall RVO::RVOSimulator::addAgent(RVOSimulator *this,Vector2 *position)

{
  void *pvVar1;
  size_type sVar2;
  undefined8 *in_RSI;
  vector<RVO::Agent_*,_std::allocator<RVO::Agent_*>_> *in_RDI;
  Agent *agent;
  vector<RVO::Agent_*,_std::allocator<RVO::Agent_*>_> *in_stack_ffffffffffffffd0;
  Agent *in_stack_ffffffffffffffe0;
  size_t local_8;
  
  if (in_RDI[2].super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
      super__Vector_impl_data._M_start == (pointer)0x0) {
    local_8 = RVO_ERROR;
  }
  else {
    pvVar1 = operator_new(0x90);
    Agent::Agent(in_stack_ffffffffffffffe0);
    *(undefined8 *)((long)pvVar1 + 0x50) = *in_RSI;
    *(Agent **)((long)pvVar1 + 0x60) =
         in_RDI[2].super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
         super__Vector_impl_data._M_start[0xc];
    sVar2 = std::vector<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>::size(in_RDI);
    *(size_type *)((long)pvVar1 + 0x68) = sVar2;
    *(Agent **)((long)pvVar1 + 0x70) =
         in_RDI[2].super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
         super__Vector_impl_data._M_start[0xe];
    *(undefined4 *)((long)pvVar1 + 0x78) =
         *(undefined4 *)
          (in_RDI[2].super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
           super__Vector_impl_data._M_start + 0xf);
    *(undefined4 *)((long)pvVar1 + 0x7c) =
         *(undefined4 *)
          ((long)in_RDI[2].super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
                 super__Vector_impl_data._M_start + 0x7c);
    *(undefined4 *)((long)pvVar1 + 0x80) =
         *(undefined4 *)
          (in_RDI[2].super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
           super__Vector_impl_data._M_start + 0x10);
    *(undefined4 *)((long)pvVar1 + 0x84) =
         *(undefined4 *)
          ((long)in_RDI[2].super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
                 super__Vector_impl_data._M_start + 0x84);
    *(undefined4 *)((long)pvVar1 + 0x88) =
         *(undefined4 *)
          (in_RDI[2].super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
           super__Vector_impl_data._M_start + 0x11);
    std::vector<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>::push_back
              (in_stack_ffffffffffffffd0,(value_type *)in_RDI);
    sVar2 = std::vector<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>::size(in_RDI);
    local_8 = sVar2 - 1;
  }
  return local_8;
}

Assistant:

std::size_t RVOSimulator::addAgent(const Vector2 &position) {
  if (defaultAgent_ != NULL) {
    Agent *const agent = new Agent();
    agent->position_ = position;
    agent->velocity_ = defaultAgent_->velocity_;
    agent->id_ = agents_.size();
    agent->maxNeighbors_ = defaultAgent_->maxNeighbors_;
    agent->maxSpeed_ = defaultAgent_->maxSpeed_;
    agent->neighborDist_ = defaultAgent_->neighborDist_;
    agent->radius_ = defaultAgent_->radius_;
    agent->timeHorizon_ = defaultAgent_->timeHorizon_;
    agent->timeHorizonObst_ = defaultAgent_->timeHorizonObst_;
    agents_.push_back(agent);

    return agents_.size() - 1U;
  }

  return RVO_ERROR;
}